

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_genparams.hpp
# Opt level: O0

void __thiscall
iutest::detail::iuRangeParamsGenerator<char>::~iuRangeParamsGenerator
          (iuRangeParamsGenerator<char> *this)

{
  iuRangeParamsGenerator<char> *this_local;
  
  ~iuRangeParamsGenerator(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

class iuRangeParamsGenerator IUTEST_CXX_FINAL : public iuIParamGenerator<T>
{
    T m_begin;
    T m_end;
    T m_step;
    T m_cur;
public:
    /**
     * @brief   コンストラクタ
     * @param [in]  begin   = 開始値
     * @param [in]  end     = 終了値
     * @param [in]  step    = 増値
    */
    iuRangeParamsGenerator(T begin, T end, T step)
        : m_begin(begin)
        , m_end(end)
        , m_step(step)
        , m_cur(begin)
    {
    }

public:
    virtual void    Begin() IUTEST_CXX_OVERRIDE { m_cur = m_begin; }